

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O3

void shared_strings_callback_data_initialize
               (shared_strings_callback_data *data,sharedstringlist *sharedstrings)

{
  data->xmlparser = (XML_Parser)0x0;
  data->sharedstrings = sharedstrings;
  data->insst = 0;
  data->insi = 0;
  data->intext = 0;
  data->text = (XML_Char *)0x0;
  data->textlen = 0;
  data->skiptag = (XML_Char *)0x0;
  data->skiptagcount = 0;
  data->skip_start = (XML_StartElementHandler)0x0;
  data->skip_end = (XML_EndElementHandler)0x0;
  data->skip_data = (XML_CharacterDataHandler)0x0;
  return;
}

Assistant:

void shared_strings_callback_data_initialize (struct shared_strings_callback_data* data, struct sharedstringlist* sharedstrings)
{
  data->xmlparser = NULL;
  data->sharedstrings = sharedstrings;
  data->insst = 0;
  data->insi = 0;
  data->intext = 0;
  data->text = NULL;
  data->textlen = 0;
  data->skiptag = NULL;
  data->skiptagcount = 0;
  data->skip_start = NULL;
  data->skip_end = NULL;
  data->skip_data = NULL;
}